

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_residual_test.c
# Opt level: O0

void __thiscall lu_residual_test(lu *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  int m_00;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *x;
  double *x_00;
  lu_int *in_RCX;
  lu_int *in_RDX;
  lu_int *in_RSI;
  void *in_RDI;
  double *in_R8;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double d;
  double norm_btran_res;
  double norm_btran;
  double norm_ftran_res;
  double norm_ftran;
  lu_int pos;
  lu_int jpivot;
  lu_int ipivot;
  lu_int k;
  lu_int i;
  double *lhs;
  double *rhs;
  double *Uvalue;
  lu_int *Uindex;
  double *Lvalue;
  lu_int *Lindex;
  double *row_pivot;
  lu_int *Ubegin;
  lu_int *Ltbegin_p;
  lu_int *Lbegin_p;
  lu_int *pivotrow;
  lu_int *pivotcol;
  lu_int *p;
  lu_int rank;
  lu_int m;
  double local_d8;
  int local_ac;
  int local_a0;
  int local_9c;
  
  m_00 = *(int *)((long)in_RDI + 0x54);
  iVar1 = *(int *)((long)in_RDI + 0x13c);
  lVar4 = *(long *)((long)in_RDI + 0x250);
  lVar5 = *(long *)((long)in_RDI + 0x1d8);
  lVar6 = *(long *)((long)in_RDI + 0x1e8);
  lVar7 = *(long *)((long)in_RDI + 0x278);
  lVar8 = *(long *)((long)in_RDI + 0x240);
  lVar9 = *(long *)((long)in_RDI + 0x280);
  lVar10 = *(long *)((long)in_RDI + 0x2b0);
  lVar11 = *(long *)((long)in_RDI + 0x1a0);
  lVar12 = *(long *)((long)in_RDI + 0x1b8);
  lVar13 = *(long *)((long)in_RDI + 0x1a8);
  lVar14 = *(long *)((long)in_RDI + 0x1c0);
  x = *(double **)((long)in_RDI + 0x298);
  x_00 = *(double **)((long)in_RDI + 0x2a0);
  for (local_a0 = 0; iVar2 = m_00, local_a0 < m_00; local_a0 = local_a0 + 1) {
    local_d8 = 0.0;
    local_ac = *(int *)(lVar8 + (long)local_a0 * 4);
    while (iVar2 = *(int *)(lVar11 + (long)local_ac * 4), -1 < iVar2) {
      local_d8 = x_00[iVar2] * *(double *)(lVar12 + (long)local_ac * 8) + local_d8;
      local_ac = local_ac + 1;
    }
    iVar2 = *(int *)(lVar4 + (long)local_a0 * 4);
    x[iVar2] = (double)(~-(ulong)(local_d8 <= 0.0) & 0xbff0000000000000 |
                       -(ulong)(local_d8 <= 0.0) & 0x3ff0000000000000);
    x_00[iVar2] = x[iVar2] - local_d8;
  }
  while (local_a0 = iVar2 + -1, -1 < local_a0) {
    iVar2 = *(int *)(lVar6 + (long)local_a0 * 4);
    dVar15 = x_00[iVar2] / *(double *)(lVar10 + (long)iVar2 * 8);
    x_00[iVar2] = dVar15;
    local_ac = *(int *)(lVar9 + (long)iVar2 * 4);
    while (iVar3 = *(int *)(lVar13 + (long)local_ac * 4), iVar2 = local_a0, -1 < iVar3) {
      x_00[iVar3] = -dVar15 * *(double *)(lVar14 + (long)local_ac * 8) + x_00[iVar3];
      local_ac = local_ac + 1;
    }
  }
  for (local_a0 = 0; iVar2 = iVar1, local_a0 < iVar1; local_a0 = local_a0 + 1) {
    iVar2 = *(int *)(lVar5 + (long)local_a0 * 4);
    dVar15 = x_00[*(int *)(lVar6 + (long)local_a0 * 4)];
    for (local_ac = in_RSI[iVar2]; local_ac < in_RDX[iVar2]; local_ac = local_ac + 1) {
      x[in_RCX[local_ac]] = -dVar15 * in_R8[local_ac] + x[in_RCX[local_ac]];
    }
  }
  while (local_a0 = iVar2, local_a0 < m_00) {
    iVar2 = *(int *)(lVar6 + (long)local_a0 * 4);
    x[iVar2] = x[iVar2] - x_00[iVar2];
    iVar2 = local_a0 + 1;
  }
  dVar15 = lu_onenorm(m_00,x_00);
  dVar16 = lu_onenorm(m_00,x);
  for (local_a0 = 0; iVar2 = m_00, local_a0 < m_00; local_a0 = local_a0 + 1) {
    iVar2 = *(int *)(lVar6 + (long)local_a0 * 4);
    local_d8 = 0.0;
    local_ac = *(int *)(lVar9 + (long)iVar2 * 4);
    while (iVar3 = *(int *)(lVar13 + (long)local_ac * 4), -1 < iVar3) {
      local_d8 = x_00[iVar3] * *(double *)(lVar14 + (long)local_ac * 8) + local_d8;
      local_ac = local_ac + 1;
    }
    x[iVar2] = (double)(~-(ulong)(local_d8 <= 0.0) & 0xbff0000000000000 |
                       -(ulong)(local_d8 <= 0.0) & 0x3ff0000000000000);
    x_00[iVar2] = (x[iVar2] - local_d8) / *(double *)(lVar10 + (long)iVar2 * 8);
  }
  while (local_a0 = iVar2 + -1, -1 < local_a0) {
    local_d8 = 0.0;
    local_ac = *(int *)(lVar7 + (long)local_a0 * 4);
    while (iVar2 = *(int *)(lVar11 + (long)local_ac * 4), -1 < iVar2) {
      local_d8 = x_00[iVar2] * *(double *)(lVar12 + (long)local_ac * 8) + local_d8;
      local_ac = local_ac + 1;
    }
    iVar2 = *(int *)(lVar4 + (long)local_a0 * 4);
    x_00[iVar2] = x_00[iVar2] - local_d8;
    iVar2 = local_a0;
  }
  for (local_a0 = 0; local_a0 < iVar1; local_a0 = local_a0 + 1) {
    iVar2 = *(int *)(lVar6 + (long)local_a0 * 4);
    iVar3 = *(int *)(lVar5 + (long)local_a0 * 4);
    local_d8 = 0.0;
    for (local_ac = in_RSI[iVar3]; local_ac < in_RDX[iVar3]; local_ac = local_ac + 1) {
      local_d8 = x_00[in_RCX[local_ac]] * in_R8[local_ac] + local_d8;
    }
    x[iVar2] = x[iVar2] - local_d8;
  }
  while (local_a0 = iVar1, local_a0 < m_00) {
    iVar1 = *(int *)(lVar6 + (long)local_a0 * 4);
    x[iVar1] = x[iVar1] - x_00[iVar1];
    iVar1 = local_a0 + 1;
  }
  dVar17 = lu_onenorm(m_00,x_00);
  dVar18 = lu_onenorm(m_00,x);
  lu_matrix_norm(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  dVar16 = dVar16 / (*(double *)((long)in_RDI + 0x120) * dVar15 + (double)m_00);
  dVar18 = dVar18 / (*(double *)((long)in_RDI + 0x128) * dVar17 + (double)m_00);
  dVar15 = dVar18;
  if (dVar18 <= dVar16) {
    dVar15 = dVar16;
  }
  *(ulong *)((long)in_RDI + 0x130) =
       ~-(ulong)NAN(dVar16) & (ulong)dVar15 | -(ulong)NAN(dVar16) & (ulong)dVar18;
  for (local_9c = 0; local_9c < m_00; local_9c = local_9c + 1) {
    x[local_9c] = 0.0;
  }
  return;
}

Assistant:

void lu_residual_test(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m                  = this->m;
    const lu_int rank               = this->rank;
    const lu_int *p                 = this->p;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin_p          = this->Lbegin_p;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    double *rhs                     = this->work0;
    double *lhs                     = this->work1;

    lu_int i, k, ipivot, jpivot, pos;
    double norm_ftran, norm_ftran_res, norm_btran, norm_btran_res, d;

    assert(this->nupdate == 0);

    /* --------------------------------- */
    /* Residual Test with Forward System */
    /* --------------------------------- */

    /* Compute lhs = L\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        d = 0.0;
        for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        ipivot = p[k];
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = rhs[ipivot] - d;
    }

    /* Overwrite lhs by U\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        ipivot = pivotrow[k];
        d = lhs[ipivot] /= row_pivot[ipivot];
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            lhs[i] -= d * Uvalue[pos];
        }
    }

    /* Overwrite rhs by the residual rhs-B*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = lhs[ipivot];
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            rhs[Bi[pos]] -= d * Bx[pos];
        }
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_ftran = lu_onenorm(m, lhs);
    norm_ftran_res = lu_onenorm(m, rhs);

    /* ---------------------------------- */
    /* Residual Test with Backward System */
    /* ---------------------------------- */

    /* Compute lhs = U'\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        ipivot = pivotrow[k];
        d = 0.0;
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Uvalue[pos];
        }
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = (rhs[ipivot] - d) / row_pivot[ipivot];
    }

    /* Overwrite lhs by L'\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        d = 0.0;
        for (pos = Lbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        lhs[p[k]] -= d;
    }

    /* Overwrite rhs by the residual rhs-B'*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = 0.0;
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            d += lhs[Bi[pos]] * Bx[pos];
        }
        rhs[ipivot] -= d;
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_btran = lu_onenorm(m, lhs);
    norm_btran_res = lu_onenorm(m, rhs);

    /* -------- */
    /* Finalize */
    /* -------- */

    lu_matrix_norm(this, Bbegin, Bend, Bi, Bx);
    assert(this->onenorm > 0.0);
    assert(this->infnorm > 0.0);
    this->residual_test = fmax(norm_ftran_res / (m + this->onenorm*norm_ftran),
                               norm_btran_res / (m + this->infnorm*norm_btran));

    /* reset workspace */
    for (i = 0; i < m; i++) rhs[i] = 0;
}